

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureColorCodingCase::test
          (AttachmentTextureColorCodingCase *this)

{
  CallLogWrapper *this_00;
  GLenum in_R9D;
  GLuint renderbufferID;
  GLuint framebufferID;
  GLuint local_30;
  GLuint local_2c;
  
  local_2c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&local_2c);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,local_2c);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_30 = 0;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&local_30);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,local_30);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8051,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,local_30);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8ce0,0x8210,0x2601,in_R9D);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&local_30);
  local_30 = 0;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&local_30);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,local_30);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8c43,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,local_30);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8ce0,0x8210,0x8c40,in_R9D);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&local_30);
  local_30 = 0;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&local_30);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,local_30);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x81a5,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,local_30);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8d00,0x8210,0x2601,in_R9D);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&local_30);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&local_2c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// rgb8 color
		{
			GLuint renderbufferID = 0;
			glGenRenderbuffers(1, &renderbufferID);
			glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
			glRenderbufferStorage(GL_RENDERBUFFER, GL_RGB8, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbufferID);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING, GL_LINEAR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
			glDeleteRenderbuffers(1, &renderbufferID);
		}

		// srgb8_alpha8 color
		{
			GLuint renderbufferID = 0;
			glGenRenderbuffers(1, &renderbufferID);
			glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
			glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbufferID);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING, GL_SRGB);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
			glDeleteRenderbuffers(1, &renderbufferID);
		}

		// depth
		{
			GLuint renderbufferID = 0;
			glGenRenderbuffers(1, &renderbufferID);
			glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
			glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT16, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, renderbufferID);
			expectError(GL_NO_ERROR);

			checkAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING, GL_LINEAR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
			glDeleteRenderbuffers(1, &renderbufferID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}